

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_SimpleEmptyKey::_Run(_Test_SimpleEmptyKey *this)

{
  int iVar1;
  long lVar2;
  char *__end;
  Random rnd;
  Random local_84;
  string local_80;
  char *local_60;
  size_t sStack_58;
  char local_50 [16];
  Slice local_40;
  
  lVar2 = 0;
  do {
    Harness::Init(&this->super_Harness,(TestArgs *)(kTestArgList + lVar2));
    iVar1 = test::RandomSeed();
    local_84.seed_ = iVar1 + 1U & 0x7fffffff;
    if ((local_84.seed_ == 0x7fffffff) || (local_84.seed_ == 0)) {
      local_84.seed_ = 1;
    }
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"","");
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"v","");
    local_40.data_ = local_60;
    local_40.size_ = sStack_58;
    Constructor::Add((this->super_Harness).constructor_,&local_80,&local_40);
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    Harness::Test(&this->super_Harness,&local_84);
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0xc0);
  return;
}

Assistant:

TEST(Harness, SimpleEmptyKey) {
  for (int i = 0; i < kNumTestArgs; i++) {
    Init(kTestArgList[i]);
    Random rnd(test::RandomSeed() + 1);
    Add("", "v");
    Test(&rnd);
  }
}